

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O3

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *lhs,long *param_2,undefined8 param_3)

{
  rt_expression_interface<double> *prVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  
  prVar1 = (rt_expression_interface<double> *)operator_new(0x20);
  pp_Var2 = (_func_int **)(**(code **)(*lhs + 0x90))(lhs,param_3);
  pp_Var3 = (_func_int **)operator_new(8);
  *pp_Var3 = (_func_int *)&PTR__op_interface_00112ae0;
  pp_Var4 = (_func_int **)(**(code **)(*param_2 + 0x90))(param_2,param_3);
  prVar1->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00112840;
  prVar1[1]._vptr_rt_expression_interface = pp_Var2;
  prVar1[2]._vptr_rt_expression_interface = pp_Var3;
  prVar1[3]._vptr_rt_expression_interface = pp_Var4;
  return prVar1;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * lhs, op_plus<NumericT>, const InterfaceType * rhs, const InterfaceType * diff_var)
  {
      return new rt_binary_expr<InterfaceType>( lhs->diff(diff_var),
                                                new op_binary<op_plus<NumericT>, InterfaceType>(),
                                                rhs->diff(diff_var) );
  }